

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O3

uint32_t __thiscall Buffer::CopyAndRemove(Buffer *this,char *out,uint32_t l)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  BufferChain *pBVar4;
  BufferChain *pBVar5;
  uint local_34;
  
  if (this->m_head == (BufferChain *)0x0) {
    local_34 = 0;
  }
  else {
    local_34 = 0;
    pBVar4 = this->m_head;
    do {
      uVar1 = pBVar4->write;
      uVar2 = pBVar4->read;
      if (uVar1 < uVar2) {
        __assert_fail("write >= read",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/alphavip[P]pollevent/loop/Buffer.cpp"
                      ,0x14,"uint16_t BufferChain::GetCanReadCount()");
      }
      if (uVar1 != uVar2) {
        uVar3 = (uint)(ushort)(uVar1 - uVar2);
        if (l < uVar3) {
          if (0xfeb < uVar2) goto LAB_00104dc2;
          memcpy(out + local_34,pBVar4->chain + uVar2,(ulong)l);
          local_34 = local_34 + l;
          this->len = this->len - l;
          pBVar4->read = pBVar4->read + (short)l;
          pBVar5 = this->m_head;
        }
        else {
          if (0xfeb < uVar2) {
LAB_00104dc2:
            __assert_fail("read < _BUFFER_CHAIN_LEN",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/alphavip[P]pollevent/loop/Buffer.cpp"
                          ,8,"char *BufferChain::GetReadAddr()");
          }
          memcpy(out + local_34,pBVar4->chain + uVar2,(ulong)uVar3);
          this->len = this->len - uVar3;
          local_34 = local_34 + uVar3;
          pBVar5 = pBVar4->nextpkt;
          (*this->_vptr_Buffer[1])(this,pBVar4);
          this->m_head = pBVar5;
          l = l - uVar3;
          if (l != 0) goto LAB_00104d38;
        }
        if (pBVar5 != (BufferChain *)0x0) {
          return local_34;
        }
        break;
      }
      pBVar5 = pBVar4->nextpkt;
      (*this->_vptr_Buffer[1])(this,pBVar4);
      this->m_head = pBVar5;
LAB_00104d38:
      pBVar4 = pBVar5;
    } while (pBVar5 != (BufferChain *)0x0);
  }
  this->m_end = (BufferChain *)0x0;
  return local_34;
}

Assistant:

uint32_t Buffer::CopyAndRemove(char *out, uint32_t l)
{
    uint32_t ret = 0;
    for(BufferChain* buff = this->m_head; buff != nullptr;)
    {
        uint16_t canReadCount = buff->GetCanReadCount();
        if(canReadCount == 0)
        {
            BufferChain* bc = buff->nextpkt;
            Cycle(buff);
            buff = bc;
            m_head = bc;
            continue;
        }

        if(l < canReadCount)
        {
            memcpy(out + ret, buff->GetReadAddr(), l);
            ret += l;
            len -= l;
            buff->read += l;
            break;
        }
        else
        {
            memcpy(out + ret, buff->GetReadAddr(), canReadCount);
            ret += canReadCount;
            l -= canReadCount;
            len -= canReadCount;

            BufferChain* bc = buff->nextpkt;
            Cycle(buff);
            buff = bc;
            m_head = bc;

            if(l == 0)
                break;
        }

    }

    if(m_head == nullptr)
        m_end = nullptr;

    return ret;
}